

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3.cpp
# Opt level: O0

void envelope_calc(opl_slot *slot)

{
  byte bVar1;
  byte bVar2;
  Bit8u local_13;
  Bit8u inc;
  Bit8u rate_l;
  Bit8u rate_h;
  opl_slot *slot_local;
  
  bVar1 = (byte)((int)(uint)slot->eg_rate >> 2);
  bVar2 = slot->eg_rate & 3;
  local_13 = '\0';
  if (""[bVar1] < '\x01') {
    local_13 = eg_incstep[""[bVar1]][bVar2][(int)(slot->chip->timer & 7)] << (-""[bVar1] & 0x1fU);
  }
  else if (((uint)slot->chip->timer & (1 << (""[bVar1] & 0x1fU)) - 1U) == 0) {
    local_13 = eg_incstep[""[bVar1]][bVar2]
               [(int)((int)(uint)slot->chip->timer >> (""[bVar1] & 0x1fU) & 7)];
  }
  slot->eg_inc = local_13;
  slot->eg_out = slot->eg_rout + (ushort)slot->reg_tl * 4 +
                 (short)((int)(uint)slot->eg_ksl >> ("\b\x01\x02"[slot->reg_ksl] & 0x1f)) +
                 (ushort)*slot->trem;
  (*envelope_gen[slot->eg_gen])(slot);
  return;
}

Assistant:

void envelope_calc(opl_slot *slot) {
	Bit8u rate_h, rate_l;
	rate_h = slot->eg_rate >> 2;
	rate_l = slot->eg_rate & 3;
	Bit8u inc = 0;
	if (eg_incsh[rate_h] > 0) {
		if ((slot->chip->timer & ((1 << eg_incsh[rate_h]) - 1)) == 0) {
			inc = eg_incstep[eg_incdesc[rate_h]][rate_l][((slot->chip->timer) >> eg_incsh[rate_h]) & 0x07];
		}
	}
	else {
		inc = eg_incstep[eg_incdesc[rate_h]][rate_l][slot->chip->timer & 0x07] << (-eg_incsh[rate_h]);
	}
	slot->eg_inc = inc;
	slot->eg_out = slot->eg_rout + (slot->reg_tl << 2) + (slot->eg_ksl >> kslshift[slot->reg_ksl]) + *slot->trem;
	envelope_gen[slot->eg_gen](slot);
}